

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

String * asl::Process::loadedLibPath(String *__return_storage_ptr__,String *lib)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  undefined8 __s;
  long lVar6;
  FILE *local_98;
  Array<asl::String> parts;
  String line;
  String name2;
  String name1;
  
  local_98 = fopen("/proc/self/maps","rt");
  if ((local_98 == (FILE *)0x0) &&
     (local_98 = fopen("/proc/curproc/map","rt"), local_98 == (FILE *)0x0)) {
    String::String(__return_storage_ptr__,"");
  }
  else {
    operator+(&name2,'/',lib);
    String::operator+(&name1,&name2,".so");
    String::~String(&name2);
    operator+(&line,"/lib",lib);
    String::operator+(&name2,&line,".so");
    String::~String(&line);
    String::String(&line,1000,1000);
    while( true ) {
      iVar3 = feof(local_98);
      if (iVar3 != 0) break;
      __s = &line.field_2;
      if (line._size != 0) {
        __s = line.field_2._str;
      }
      parts._a = &line;
      pcVar4 = fgets((char *)__s,1000,local_98);
      SafeString::~SafeString((SafeString *)&parts);
      if (pcVar4 == (char *)0x0) break;
      String::split((String *)&parts);
      lVar6 = -1;
      lVar1 = 0;
LAB_0013aa73:
      lVar5 = lVar1;
      lVar6 = lVar6 + 1;
      if (lVar6 < *(int *)&parts._a[-1].field_2) {
        bVar2 = String::contains((String *)((long)&(parts._a)->_size + lVar5),&name1);
        if (!bVar2) goto code_r0x0013aa96;
        goto LAB_0013aacb;
      }
      Array<asl::String>::~Array(&parts);
    }
    fclose(local_98);
    String::String(__return_storage_ptr__,"");
LAB_0013aaf3:
    String::~String(&line);
    String::~String(&name2);
    String::~String(&name1);
  }
  return __return_storage_ptr__;
code_r0x0013aa96:
  bVar2 = String::contains((String *)((long)&(parts._a)->_size + lVar5),&name2);
  lVar1 = lVar5 + 0x18;
  if (bVar2) {
LAB_0013aacb:
    fclose(local_98);
    String::String(__return_storage_ptr__,(String *)((long)&(parts._a)->_size + lVar5));
    Array<asl::String>::~Array(&parts);
    goto LAB_0013aaf3;
  }
  goto LAB_0013aa73;
}

Assistant:

String Process::loadedLibPath(const String& lib)
{
	//TextFile mapfile("/proc/self/maps", File::READ);
	FILE* mapfile = fopen("/proc/self/maps", "rt"); // linux
	if(!mapfile)
		mapfile = fopen("/proc/curproc/map", "rt"); // freebsd
	if(!mapfile)
		return "";
	
	String name1 = '/' + lib + ".so";
	String name2 = "/lib" + lib + ".so";
	String line(1000, 1000);

	while(!feof(mapfile))
	{
		//String line = mapfile.readLine();
		char* s = fgets(SafeString(line), 1000, mapfile);
		if(!s) break;
		Array<String> parts = line.split();
		for(int i=0; i<parts.length(); i++)
		if(parts[i].contains(name1) || parts[i].contains(name2))
		{
			fclose(mapfile);
			return parts[i];
		}
	}
	fclose(mapfile);
	return "";
}